

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdGetVectorLength(INSTRUX *Instrux)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if ((Instrux->field_0x8 & 0x46) != 0) {
    if ((Instrux->TupleType & 0xfc) == 4) {
      Instrux->field_0x1 = Instrux->field_0x1 & 0xf;
      return 0;
    }
    if (((uint)Instrux->field_73 & 0x40000) == 0) {
      uVar1 = *(uint *)Instrux & 0xffff0fff | 0x5000;
    }
    else {
      uVar1 = *(uint *)Instrux & 0xffff0fff | 0xa000;
    }
    *(uint *)Instrux = uVar1;
    return 0;
  }
  switch((uint)Instrux->Exs >> 0xe & 3) {
  case 0:
    uVar2 = *(uint *)Instrux & 0xffff0fff;
    goto LAB_0015da06;
  case 1:
    uVar1 = *(uint *)Instrux;
    *(uint *)Instrux = uVar1 & 0xffffcfff | 0x1000;
    uVar2 = 0x4000;
    uVar3 = ((uint)Instrux->Attributes & 0x200) << 5;
    uVar1 = uVar1 & 0xffff0fff | 0x1000;
    break;
  case 2:
    uVar1 = *(uint *)Instrux;
    *(uint *)Instrux = uVar1 & 0xffffcfff | 0x2000;
    uVar2 = 0x8000;
    uVar3 = ((uint)Instrux->Attributes & 0x200) << 6;
    uVar1 = uVar1 & 0xffff0fff | 0x2000;
    break;
  case 3:
    return 0x80000041;
  }
  uVar2 = (uVar1 | uVar3) ^ uVar2;
LAB_0015da06:
  *(uint *)Instrux = uVar2;
  if (((uVar2 & 0xc000) == 0) && ((Instrux->Attributes & 0x8000) != 0)) {
    return 0x80000002;
  }
  return 0;
}

Assistant:

static NDSTATUS
NdGetVectorLength(
    INSTRUX *Instrux
    )
{
    if (Instrux->HasEr || Instrux->HasSae || Instrux->HasIgnEr)
    {
        // Embedded rounding or SAE present, force the vector length to 512 or scalar.
        if ((Instrux->TupleType == ND_TUPLE_T1S) || 
            (Instrux->TupleType == ND_TUPLE_T1S8) ||
            (Instrux->TupleType == ND_TUPLE_T1S16) ||
            (Instrux->TupleType == ND_TUPLE_T1F))
        {
            // Scalar instruction, vector length is 128 bits.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_128;
        }
        else if (Instrux->Evex.u == 0)
        {
            // AVX 10 allows SAE/ER for 256-bit vector length, if EVEX.U is 0.
            // It is unclear whether the EVEX.U bit is ignored or reserved for scalar instructions.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_256;
        }
        else
        {
            // Legacy or AVX 10 instruction with U bit set, vector length is 512 bits.
            Instrux->VecMode = Instrux->EfVecMode = ND_VECM_512;
        }

        return ND_STATUS_SUCCESS;
    }

    // Decode EVEX vector length. Also take into consideration the "ignore L" flag.
    switch (Instrux->Exs.l)
    {
    case 0:
        Instrux->VecMode = ND_VECM_128;
        Instrux->EfVecMode = ND_VECM_128;
        break;
    case 1:
        Instrux->VecMode = ND_VECM_256;
        Instrux->EfVecMode = (Instrux->Attributes & ND_FLAG_LIG) ? ND_VECM_128 : ND_VECM_256;
        break;
    case 2:
        Instrux->VecMode = ND_VECM_512;
        Instrux->EfVecMode = (Instrux->Attributes & ND_FLAG_LIG) ? ND_VECM_128 : ND_VECM_512;
        break;
    default:
        return ND_STATUS_BAD_EVEX_LL;
    }

    // Some instructions don't support 128 bit vectors.
    if ((ND_VECM_128 == Instrux->EfVecMode) && (0 != (Instrux->Attributes & ND_FLAG_NOL0)))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    return ND_STATUS_SUCCESS;
}